

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O1

void __thiscall
tcu::CompressedTexture::CompressedTexture
          (CompressedTexture *this,CompressedTexFormat format,int width,int height,int depth)

{
  this->m_format = COMPRESSEDTEXFORMAT_LAST;
  this->m_width = 0;
  this->m_height = 0;
  *(undefined8 *)&this->m_depth = 0;
  *(undefined8 *)
   ((long)&(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined4 *)
   ((long)&(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  setStorage(this,format,width,height,depth);
  return;
}

Assistant:

CompressedTexture::CompressedTexture (CompressedTexFormat format, int width, int height, int depth)
	: m_format	(COMPRESSEDTEXFORMAT_LAST)
	, m_width	(0)
	, m_height	(0)
	, m_depth	(0)
{
	setStorage(format, width, height, depth);
}